

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int iVar1;
  float *__src;
  unsigned_short *__src_00;
  int n;
  float *__dest;
  long lVar2;
  unsigned_short *__dest_00;
  int iVar3;
  
  if ((this->IndexLookup).Size < new_size) {
    iVar1 = (this->IndexAdvanceX).Capacity;
    if (iVar1 < new_size) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      if (iVar3 <= new_size) {
        iVar3 = new_size;
      }
      if (iVar1 < iVar3) {
        __dest = (float *)ImGui::MemAlloc((long)iVar3 << 2);
        __src = (this->IndexAdvanceX).Data;
        if (__src != (float *)0x0) {
          memcpy(__dest,__src,(long)(this->IndexAdvanceX).Size << 2);
          ImGui::MemFree((this->IndexAdvanceX).Data);
        }
        (this->IndexAdvanceX).Data = __dest;
        (this->IndexAdvanceX).Capacity = iVar3;
      }
    }
    iVar1 = (this->IndexAdvanceX).Size;
    lVar2 = (long)iVar1;
    if (iVar1 < new_size) {
      do {
        (this->IndexAdvanceX).Data[lVar2] = -1.0;
        lVar2 = lVar2 + 1;
      } while (new_size != lVar2);
    }
    (this->IndexAdvanceX).Size = new_size;
    iVar1 = (this->IndexLookup).Capacity;
    if (iVar1 < new_size) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      if (iVar3 <= new_size) {
        iVar3 = new_size;
      }
      if (iVar1 < iVar3) {
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar3 * 2);
        __src_00 = (this->IndexLookup).Data;
        if (__src_00 != (unsigned_short *)0x0) {
          memcpy(__dest_00,__src_00,(long)(this->IndexLookup).Size * 2);
          ImGui::MemFree((this->IndexLookup).Data);
        }
        (this->IndexLookup).Data = __dest_00;
        (this->IndexLookup).Capacity = iVar3;
      }
    }
    iVar1 = (this->IndexLookup).Size;
    lVar2 = (long)iVar1;
    if (iVar1 < new_size) {
      do {
        (this->IndexLookup).Data[lVar2] = 0xffff;
        lVar2 = lVar2 + 1;
      } while (new_size != lVar2);
    }
    (this->IndexLookup).Size = new_size;
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexAdvanceX.Size == IndexLookup.Size);
    if (new_size <= IndexLookup.Size)
        return;
    IndexAdvanceX.resize(new_size, -1.0f);
    IndexLookup.resize(new_size, (ImWchar)-1);
}